

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# magic_enum_containers.hpp
# Opt level: O2

pair<magic_enum::containers::detail::FilteredIterator<const_magic_enum::containers::set<Color,_std::less<Color>_>_*,_const_Color_*,_magic_enum::containers::set<Color,_std::less<Color>_>::Getter,_magic_enum::containers::set<Color,_std::less<Color>_>::Predicate>,_bool>
* __thiscall
magic_enum::containers::set<Color,_std::less<Color>_>::insert
          (pair<magic_enum::containers::detail::FilteredIterator<const_magic_enum::containers::set<Color,_std::less<Color>_>_*,_const_Color_*,_magic_enum::containers::set<Color,_std::less<Color>_>::Getter,_magic_enum::containers::set<Color,_std::less<Color>_>::Predicate>,_bool>
           *__return_storage_ptr__,set<Color,_std::less<Color>_> *this,value_type *value)

{
  byte bVar1;
  bool bVar2;
  enable_if_t<Color,_optional<std::size_t>_> eVar3;
  reference ref;
  FilteredIterator<const_magic_enum::containers::set<Color,_std::less<Color>_>_*,_const_Color_*,_magic_enum::containers::set<Color,_std::less<Color>_>::Getter,_magic_enum::containers::set<Color,_std::less<Color>_>::Predicate>
  local_68;
  reference local_40;
  
  eVar3 = enum_index<Color,(magic_enum::detail::enum_subtype)1>(*value);
  if (((undefined1  [16])
       eVar3.super__Optional_base<unsigned_long,_true,_true>._M_payload.
       super__Optional_payload_base<unsigned_long> & (undefined1  [16])0x1) == (undefined1  [16])0x0
     ) {
    (__return_storage_ptr__->first).parent = this;
    (__return_storage_ptr__->first).first =
         &magic_enum::detail::values_v<Color,(magic_enum::detail::enum_subtype)1>;
    (__return_storage_ptr__->first).last = &magic_enum::detail::enum_name_v<Color,(Color)1>;
    (__return_storage_ptr__->first).current = &magic_enum::detail::enum_name_v<Color,(Color)1>;
    __return_storage_ptr__->second = false;
  }
  else {
    bitset<Color,_magic_enum::containers::detail::indexing<Color,_std::less<Color>,_void>_>::
    operator[](&local_40,&this->a,*value);
    bVar1 = local_40.parent[local_40.num_index].a._M_elems[0];
    bVar2 = (local_40.bit_index & bVar1) == 0;
    if (bVar2) {
      local_40.parent[local_40.num_index].a._M_elems[0] = local_40.bit_index | bVar1;
      this->s = this->s + 1;
    }
    detail::
    FilteredIterator<const_magic_enum::containers::set<Color,_std::less<Color>_>_*,_const_Color_*,_magic_enum::containers::set<Color,_std::less<Color>_>::Getter,_magic_enum::containers::set<Color,_std::less<Color>_>::Predicate>
    ::FilteredIterator(&local_68,this,
                       &magic_enum::detail::values_v<Color,(magic_enum::detail::enum_subtype)1>,
                       &magic_enum::detail::enum_name_v<Color,(Color)1>,
                       &magic_enum::detail::values_v<Color,(magic_enum::detail::enum_subtype)1> +
                       eVar3.super__Optional_base<unsigned_long,_true,_true>._M_payload.
                       super__Optional_payload_base<unsigned_long>._M_payload);
    *(undefined8 *)&(__return_storage_ptr__->first).field_0x20 = local_68._32_8_;
    (__return_storage_ptr__->first).last = local_68.last;
    (__return_storage_ptr__->first).current = local_68.current;
    (__return_storage_ptr__->first).parent = local_68.parent;
    (__return_storage_ptr__->first).first = local_68.first;
    __return_storage_ptr__->second = bVar2;
  }
  return __return_storage_ptr__;
}

Assistant:

constexpr std::pair<iterator, bool> insert(const value_type& value) noexcept {
    if (auto i = index_type::at(value)) {
      typename container_type::reference ref = a[value];
      bool r = !ref;
      if (r) {
        ref = true;
        ++s;
      }

      return {iterator{this, index_type::begin(), index_type::end(), index_type::it(*i)}, r};
    }
    return {end(), false};
  }